

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.h
# Opt level: O0

void __thiscall
Js::JavascriptNativeArray::SetArrayCallSite
          (JavascriptNativeArray *this,ProfileId index,
          RecyclerWeakReference<Js::FunctionBody> *weakRef)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RecyclerWeakReference<Js::FunctionBody> **ppRVar4;
  RecyclerWeakReference<Js::FunctionBody> *weakRef_local;
  ProfileId index_local;
  JavascriptNativeArray *this_local;
  
  if (weakRef == (RecyclerWeakReference<Js::FunctionBody> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.h"
                                ,0x3f4,"(weakRef)","weakRef");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ppRVar4 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                      ((WriteBarrierPtr *)&this->weakRefToFuncBody);
  if (*ppRVar4 != (RecyclerWeakReference<Js::FunctionBody> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.h"
                                ,0x3f5,"(!weakRefToFuncBody)","!weakRefToFuncBody");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  DynamicObject::SetArrayCallSiteIndex((DynamicObject *)this,index);
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>_>::operator=
            (&this->weakRefToFuncBody,weakRef);
  return;
}

Assistant:

void SetArrayCallSite(ProfileId index, RecyclerWeakReference<FunctionBody> *weakRef)
        {
            Assert(weakRef);
            Assert(!weakRefToFuncBody);
            SetArrayCallSiteIndex(index);
            weakRefToFuncBody = weakRef;
        }